

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O2

bool __thiscall duckdb::Pipeline::IsOrderDependent(Pipeline *this)

{
  pointer prVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  DBConfig *pDVar5;
  PhysicalOperator *pPVar6;
  pointer prVar7;
  bool bVar8;
  
  pDVar5 = DBConfig::GetConfig(this->executor->context);
  if ((this->source).ptr != (PhysicalOperator *)0x0) {
    pPVar6 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(&this->source);
    uVar3 = (*pPVar6->_vptr_PhysicalOperator[0x16])(pPVar6);
    if ((char)uVar3 == '\x02') {
      return true;
    }
    if ((uVar3 & 0xff) == 0) {
      return false;
    }
  }
  prVar7 = (this->operators).
           super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  prVar1 = (this->operators).
           super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (prVar7 == prVar1) {
      if (((pDVar5->options).preserve_insertion_order == true) &&
         ((this->sink).ptr != (PhysicalOperator *)0x0)) {
        pPVar6 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(&this->sink);
        iVar4 = (*pPVar6->_vptr_PhysicalOperator[0x24])(pPVar6);
        if ((char)iVar4 != '\0') {
          return true;
        }
      }
      return false;
    }
    pPVar6 = prVar7->_M_data;
    iVar4 = (*pPVar6->_vptr_PhysicalOperator[0xe])(pPVar6);
    bVar8 = (char)iVar4 == '\0';
    bVar2 = !bVar8;
    if (bVar8) {
      return bVar2;
    }
    iVar4 = (*pPVar6->_vptr_PhysicalOperator[0xe])(pPVar6);
    prVar7 = prVar7 + 1;
  } while ((char)iVar4 != '\x02');
  return bVar2;
}

Assistant:

bool Pipeline::IsOrderDependent() const {
	auto &config = DBConfig::GetConfig(executor.context);
	if (source) {
		auto source_order = source->SourceOrder();
		if (source_order == OrderPreservationType::FIXED_ORDER) {
			return true;
		}
		if (source_order == OrderPreservationType::NO_ORDER) {
			return false;
		}
	}
	for (auto &op_ref : operators) {
		auto &op = op_ref.get();
		if (op.OperatorOrder() == OrderPreservationType::NO_ORDER) {
			return false;
		}
		if (op.OperatorOrder() == OrderPreservationType::FIXED_ORDER) {
			return true;
		}
	}
	if (!config.options.preserve_insertion_order) {
		return false;
	}
	if (sink && sink->SinkOrderDependent()) {
		return true;
	}
	return false;
}